

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::removeNamedTarget(CoreBroker *this,ActionMessage *command)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GlobalFederateId federateID;
  GlobalHandle GVar5;
  pointer pcVar6;
  size_type sVar7;
  bool bVar8;
  string_view message;
  BasicHandleInfo *pBVar9;
  action_t newAction;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  format_args args;
  string_view name_03;
  string_view fmt;
  string local_58;
  byte *local_38;
  size_t local_30;
  
  switch(command->messageAction) {
  case cmd_remove_named_input:
    name._M_str = (char *)(command->payload).heap;
    name._M_len = (command->payload).bufferSize;
    pBVar9 = HandleManager::getInterfaceHandle(&this->handles,name,INPUT);
    bVar8 = pBVar9 != (BasicHandleInfo *)0x0;
    if (pBVar9 == (BasicHandleInfo *)0x0) {
LAB_00337c0d:
      if (bVar8) {
        return;
      }
      goto switchD_00337a52_default;
    }
    ActionMessage::setAction(command,cmd_remove_publication);
    GVar5 = pBVar9->handle;
    (command->dest_id).gid = GVar5.fed_id.gid.gid;
    (command->dest_handle).hid = GVar5.handle.hid.hid;
    (command->payload).bufferSize = 0;
    routeMessage(this,command);
    newAction = cmd_remove_subscriber;
    break;
  case cmd_remove_named_filter:
    name_02._M_str = (char *)(command->payload).heap;
    name_02._M_len = (command->payload).bufferSize;
    pBVar9 = HandleManager::getInterfaceHandle(&this->handles,name_02,FILTER);
    bVar8 = pBVar9 != (BasicHandleInfo *)0x0;
    if (pBVar9 == (BasicHandleInfo *)0x0) goto LAB_00337c0d;
    ActionMessage::setAction(command,cmd_remove_endpoint);
    GVar5 = pBVar9->handle;
    (command->dest_id).gid = GVar5.fed_id.gid.gid;
    (command->dest_handle).hid = GVar5.handle.hid.hid;
    (command->payload).bufferSize = 0;
    routeMessage(this,command);
    newAction = cmd_remove_filter;
    break;
  case cmd_remove_named_publication:
    name_00._M_str = (char *)(command->payload).heap;
    name_00._M_len = (command->payload).bufferSize;
    pBVar9 = HandleManager::getInterfaceHandle(&this->handles,name_00,PUBLICATION);
    bVar8 = pBVar9 != (BasicHandleInfo *)0x0;
    if (pBVar9 == (BasicHandleInfo *)0x0) goto LAB_00337c0d;
    ActionMessage::setAction(command,cmd_remove_subscriber);
    GVar5 = pBVar9->handle;
    (command->dest_id).gid = GVar5.fed_id.gid.gid;
    (command->dest_handle).hid = GVar5.handle.hid.hid;
    (command->payload).bufferSize = 0;
    routeMessage(this,command);
    newAction = cmd_remove_publication;
    break;
  case cmd_remove_named_endpoint:
    name_01._M_str = (char *)(command->payload).heap;
    name_01._M_len = (command->payload).bufferSize;
    pBVar9 = HandleManager::getInterfaceHandle(&this->handles,name_01,ENDPOINT);
    bVar8 = pBVar9 != (BasicHandleInfo *)0x0;
    if (pBVar9 == (BasicHandleInfo *)0x0) goto LAB_00337c0d;
    ActionMessage::setAction(command,cmd_remove_filter);
    GVar5 = pBVar9->handle;
    (command->dest_id).gid = GVar5.fed_id.gid.gid;
    (command->dest_handle).hid = GVar5.handle.hid.hid;
    (command->payload).bufferSize = 0;
    routeMessage(this,command);
    newAction = cmd_remove_endpoint;
    break;
  default:
switchD_00337a52_default:
    if ((this->super_BrokerBase).field_0x294 == '\x01') {
      federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar6 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar7 = (this->super_BrokerBase).identifier._M_string_length;
      local_30 = (command->payload).bufferSize;
      local_38 = (command->payload).heap;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_38;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x29;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_58,(v11 *)"attempt to remove unrecognized target {} ",fmt,args);
      message._M_str = local_58._M_dataplus._M_p;
      message._M_len = local_58._M_string_length;
      name_03._M_str = pcVar6;
      name_03._M_len = sVar7;
      BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,3,name_03,message,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    goto LAB_00337cc5;
  }
  ActionMessage::setAction(command,newAction);
  uVar1 = command->source_id;
  uVar2 = command->source_handle;
  uVar3 = command->dest_id;
  uVar4 = command->dest_handle;
  command->source_id = (GlobalFederateId)uVar3;
  command->source_handle = (InterfaceHandle)uVar4;
  command->dest_id = (GlobalFederateId)uVar1;
  command->dest_handle = (InterfaceHandle)uVar2;
LAB_00337cc5:
  routeMessage(this,command);
  return;
}

Assistant:

void CoreBroker::removeNamedTarget(ActionMessage& command)
{
    bool foundInterface = false;
    switch (command.action()) {
        case CMD_REMOVE_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.setDestination(pub->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.setDestination(inp->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_FILTER);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                command.setAction(CMD_REMOVE_FILTER);
                command.setDestination(ept->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.swapSourceDest();
                routeMessage(command);

                foundInterface = true;
            }
        } break;
        default:
            break;
    }
    if (!foundInterface) {
        if (isRootc) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("attempt to remove unrecognized target {} ", command.name()));
        } else {
            routeMessage(command);
        }
    }
}